

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O1

int run_test_pipe_listen_without_bind(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined1 *__s;
  undefined8 unaff_RBX;
  long *plVar3;
  code **ppcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  code *pcStack_e88;
  long lStack_e80;
  long lStack_e78;
  long alStack_e70 [13];
  undefined1 auStack_e08 [232];
  long alStack_d20 [64];
  code *pcStack_b20;
  long lStack_b10;
  long lStack_b08;
  undefined1 auStack_b00 [232];
  code *pcStack_a18;
  long lStack_a08;
  long lStack_a00;
  undefined1 auStack_9f8 [232];
  undefined1 auStack_910 [2047];
  undefined1 uStack_111;
  code *pcStack_110;
  long local_100;
  long local_f8;
  undefined1 local_f0 [232];
  
  pcStack_110 = (code *)0x1b03a4;
  uVar2 = uv_default_loop();
  pcStack_110 = (code *)0x1b03b3;
  iVar1 = uv_pipe_init(uVar2,local_f0,0);
  local_f8 = (long)iVar1;
  local_100 = 0;
  if (local_f8 == 0) {
    pcStack_110 = (code *)0x1b03e4;
    iVar1 = uv_listen(local_f0,0x1000,0);
    local_f8 = (long)iVar1;
    local_100 = -0x16;
    if (local_f8 != -0x16) goto LAB_001b04b0;
    pcStack_110 = (code *)0x1b0415;
    uv_close(local_f0,close_cb);
    pcStack_110 = (code *)0x1b041a;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b0424;
    uv_run(uVar2,0);
    local_f8 = 1;
    local_100 = (long)close_cb_called;
    if (local_100 != 1) goto LAB_001b04bf;
    pcStack_110 = (code *)0x1b044a;
    unaff_RBX = uv_default_loop();
    pcStack_110 = (code *)0x1b045e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_110 = (code *)0x1b0468;
    uv_run(unaff_RBX,0);
    local_f8 = 0;
    pcStack_110 = (code *)0x1b0476;
    uVar2 = uv_default_loop();
    pcStack_110 = (code *)0x1b047e;
    iVar1 = uv_loop_close(uVar2);
    local_100 = (long)iVar1;
    if (local_f8 == local_100) {
      pcStack_110 = (code *)0x1b0496;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_110 = (code *)0x1b04b0;
    run_test_pipe_listen_without_bind_cold_1();
LAB_001b04b0:
    pcStack_110 = (code *)0x1b04bf;
    run_test_pipe_listen_without_bind_cold_2();
LAB_001b04bf:
    pcStack_110 = (code *)0x1b04ce;
    run_test_pipe_listen_without_bind_cold_3();
  }
  pcStack_110 = run_test_pipe_bind_error_long_path;
  run_test_pipe_listen_without_bind_cold_4();
  __s = auStack_910;
  pcStack_a18 = (code *)0x1b04ff;
  pcStack_110 = (code *)unaff_RBX;
  memset(__s,0x2e,0x7ff);
  uStack_111 = 0;
  pcStack_a18 = (code *)0x1b050b;
  uVar2 = uv_default_loop();
  pcStack_a18 = (code *)0x1b051a;
  iVar1 = uv_pipe_init(uVar2,auStack_9f8,0);
  if (iVar1 == 0) {
    pcStack_a18 = (code *)0x1b0534;
    iVar1 = uv_pipe_bind(auStack_9f8,auStack_910);
    if (iVar1 != -0x24) goto LAB_001b05c7;
    pcStack_a18 = (code *)0x1b054e;
    uv_close(auStack_9f8,close_cb);
    pcStack_a18 = (code *)0x1b0553;
    uVar2 = uv_default_loop();
    pcStack_a18 = (code *)0x1b055d;
    uv_run(uVar2,0);
    if (close_cb_called != 1) goto LAB_001b05cc;
    pcStack_a18 = (code *)0x1b056b;
    __s = (undefined1 *)uv_default_loop();
    pcStack_a18 = (code *)0x1b057f;
    uv_walk(__s,close_walk_cb,0);
    pcStack_a18 = (code *)0x1b0589;
    uv_run(__s,0);
    lStack_a00 = 0;
    pcStack_a18 = (code *)0x1b0597;
    uVar2 = uv_default_loop();
    pcStack_a18 = (code *)0x1b059f;
    iVar1 = uv_loop_close(uVar2);
    lStack_a08 = (long)iVar1;
    if (lStack_a00 == lStack_a08) {
      pcStack_a18 = (code *)0x1b05b7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_a18 = (code *)0x1b05c7;
    run_test_pipe_bind_error_long_path_cold_1();
LAB_001b05c7:
    pcStack_a18 = (code *)0x1b05cc;
    run_test_pipe_bind_error_long_path_cold_2();
LAB_001b05cc:
    pcStack_a18 = (code *)0x1b05d1;
    run_test_pipe_bind_error_long_path_cold_3();
  }
  pcStack_a18 = run_test_pipe_bind_or_listen_error_after_close;
  run_test_pipe_bind_error_long_path_cold_4();
  pcStack_b20 = (code *)0x1b05ed;
  pcStack_a18 = (code *)__s;
  uVar2 = uv_default_loop();
  pcStack_b20 = (code *)0x1b05fc;
  iVar1 = uv_pipe_init(uVar2,auStack_b00,0);
  lStack_b08 = (long)iVar1;
  lStack_b10 = 0;
  if (lStack_b08 == 0) {
    __s = auStack_b00;
    pcStack_b20 = (code *)0x1b062b;
    uv_close(__s,0);
    pcStack_b20 = (code *)0x1b063a;
    iVar1 = uv_pipe_bind(__s,"/tmp/uv-test-sock");
    lStack_b08 = (long)iVar1;
    lStack_b10 = -0x16;
    if (lStack_b08 != -0x16) goto LAB_001b0725;
    pcStack_b20 = (code *)0x1b066b;
    iVar1 = uv_listen(auStack_b00,0x1000,0);
    lStack_b08 = (long)iVar1;
    lStack_b10 = -0x16;
    if (lStack_b08 != -0x16) goto LAB_001b0734;
    pcStack_b20 = (code *)0x1b0690;
    uVar2 = uv_default_loop();
    pcStack_b20 = (code *)0x1b069a;
    iVar1 = uv_run(uVar2,0);
    lStack_b08 = (long)iVar1;
    lStack_b10 = 0;
    if (lStack_b08 != 0) goto LAB_001b0743;
    pcStack_b20 = (code *)0x1b06bf;
    __s = (undefined1 *)uv_default_loop();
    pcStack_b20 = (code *)0x1b06d3;
    uv_walk(__s,close_walk_cb,0);
    pcStack_b20 = (code *)0x1b06dd;
    uv_run(__s,0);
    lStack_b08 = 0;
    pcStack_b20 = (code *)0x1b06eb;
    uVar2 = uv_default_loop();
    pcStack_b20 = (code *)0x1b06f3;
    iVar1 = uv_loop_close(uVar2);
    lStack_b10 = (long)iVar1;
    if (lStack_b08 == lStack_b10) {
      pcStack_b20 = (code *)0x1b070b;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_b20 = (code *)0x1b0725;
    run_test_pipe_bind_or_listen_error_after_close_cold_1();
LAB_001b0725:
    pcStack_b20 = (code *)0x1b0734;
    run_test_pipe_bind_or_listen_error_after_close_cold_2();
LAB_001b0734:
    pcStack_b20 = (code *)0x1b0743;
    run_test_pipe_bind_or_listen_error_after_close_cold_3();
LAB_001b0743:
    pcStack_b20 = (code *)0x1b0752;
    run_test_pipe_bind_or_listen_error_after_close_cold_4();
  }
  pcStack_b20 = run_test_pipe_overlong_path;
  run_test_pipe_bind_or_listen_error_after_close_cold_5();
  plVar3 = &lStack_e80;
  pcStack_e88 = (code *)0x1b076e;
  pcStack_b20 = (code *)__s;
  uVar2 = uv_default_loop();
  pcStack_e88 = (code *)0x1b077d;
  iVar1 = uv_pipe_init(uVar2,auStack_e08,0);
  alStack_d20[0] = (long)iVar1;
  alStack_e70[0] = 0;
  if (alStack_d20[0] == 0) {
    pcStack_e88 = (code *)0x1b07bd;
    memset(alStack_d20,0x40,0x200);
    alStack_e70[0] = -0x24;
    pcStack_e88 = (code *)0x1b07dd;
    iVar1 = uv_pipe_bind2(auStack_e08,alStack_d20,0x200,1);
    lStack_e80 = (long)iVar1;
    if (alStack_e70[0] != lStack_e80) goto LAB_001b0991;
    lStack_e80 = -0x24;
    pcStack_e88 = (code *)0x1b0823;
    iVar1 = uv_pipe_connect2(alStack_e70,auStack_e08,alStack_d20,0x200,1,abort);
    lStack_e78 = (long)iVar1;
    if (lStack_e80 != lStack_e78) goto LAB_001b099e;
    pcStack_e88 = (code *)0x1b083e;
    uVar2 = uv_default_loop();
    pcStack_e88 = (code *)0x1b0848;
    iVar1 = uv_run(uVar2,0);
    lStack_e80 = (long)iVar1;
    lStack_e78 = 0;
    if (lStack_e80 != 0) goto LAB_001b09ab;
    lStack_e80 = -0x16;
    pcStack_e88 = (code *)0x1b087f;
    iVar1 = uv_pipe_bind(auStack_e08,"");
    lStack_e78 = (long)iVar1;
    if (lStack_e80 != lStack_e78) goto LAB_001b09b8;
    pcStack_e88 = (code *)0x1b08b2;
    uv_pipe_connect(alStack_e70,auStack_e08,"",connect_overlong_cb);
    pcStack_e88 = (code *)0x1b08b7;
    uVar2 = uv_default_loop();
    pcStack_e88 = (code *)0x1b08c1;
    iVar1 = uv_run(uVar2,0);
    lStack_e80 = (long)iVar1;
    lStack_e78 = 0;
    if (lStack_e80 != 0) goto LAB_001b09c5;
    lStack_e80 = 1;
    lStack_e78 = (long)connect_cb_called;
    if (lStack_e78 != 1) goto LAB_001b09d2;
    lStack_e80 = 1;
    lStack_e78 = (long)close_cb_called;
    if (lStack_e78 == 1) {
      pcStack_e88 = (code *)0x1b092a;
      uVar2 = uv_default_loop();
      pcStack_e88 = (code *)0x1b093e;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_e88 = (code *)0x1b0948;
      uv_run(uVar2,0);
      lStack_e80 = 0;
      pcStack_e88 = (code *)0x1b0955;
      uVar2 = uv_default_loop();
      pcStack_e88 = (code *)0x1b095d;
      iVar1 = uv_loop_close(uVar2);
      lStack_e78 = (long)iVar1;
      if (lStack_e80 == lStack_e78) {
        pcStack_e88 = (code *)0x1b0974;
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b09ec;
    }
  }
  else {
    pcStack_e88 = (code *)0x1b0991;
    run_test_pipe_overlong_path_cold_1();
LAB_001b0991:
    pcStack_e88 = (code *)0x1b099e;
    run_test_pipe_overlong_path_cold_2();
LAB_001b099e:
    pcStack_e88 = (code *)0x1b09ab;
    run_test_pipe_overlong_path_cold_3();
LAB_001b09ab:
    pcStack_e88 = (code *)0x1b09b8;
    run_test_pipe_overlong_path_cold_4();
LAB_001b09b8:
    pcStack_e88 = (code *)0x1b09c5;
    run_test_pipe_overlong_path_cold_5();
LAB_001b09c5:
    pcStack_e88 = (code *)0x1b09d2;
    run_test_pipe_overlong_path_cold_6();
LAB_001b09d2:
    pcStack_e88 = (code *)0x1b09df;
    run_test_pipe_overlong_path_cold_7();
  }
  pcStack_e88 = (code *)0x1b09ec;
  run_test_pipe_overlong_path_cold_8();
LAB_001b09ec:
  iVar1 = (int)&lStack_e78;
  pcStack_e88 = connect_overlong_cb;
  run_test_pipe_overlong_path_cold_9();
  pcStack_e88 = (code *)(long)iVar1;
  if (pcStack_e88 == (code *)0xffffffffffffffea) {
    connect_cb_called = connect_cb_called + 1;
    iVar1 = uv_close(*(undefined8 *)((long)plVar3 + 0x50),close_cb);
    return iVar1;
  }
  ppcVar4 = &pcStack_e88;
  connect_overlong_cb_cold_1();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(ppcVar4,0);
  return iVar1;
}

Assistant:

TEST_IMPL(pipe_listen_without_bind) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server, SOMAXCONN, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}